

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

void __thiscall MppDevServer::clear(MppDevServer *this)

{
  if (this->mSessionPool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("clear",this->mSessionPool);
    this->mSessionPool = (MppMemPool)0x0;
  }
  if (this->mBatchPool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("clear",this->mBatchPool);
    this->mBatchPool = (MppMemPool)0x0;
  }
  this->mInited = 0;
  this->mEnable = 0;
  return;
}

Assistant:

void MppDevServer::clear()
{
    if (mSessionPool) {
        mpp_mem_pool_deinit(mSessionPool);
        mSessionPool = NULL;
    }

    if (mBatchPool) {
        mpp_mem_pool_deinit(mBatchPool);
        mBatchPool = NULL;
    }
    mInited = 0;
    mEnable = 0;
}